

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall
OpenMD::SelectionCompiler::compileCommand
          (SelectionCompiler *this,vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *ltoken)

{
  uint uVar1;
  bool bVar2;
  const_reference pvVar3;
  SelectionCompiler *in_RSI;
  int tokCommand;
  Token *tokenCommand;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_00000068;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_00000070;
  
  pvVar3 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
                     ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)in_RSI,0);
  uVar1 = pvVar3->tok;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
            (in_stack_00000070,in_stack_00000068);
  if (((uVar1 & 0x200) != 0) && (bVar2 = compileExpression(in_RSI), !bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool SelectionCompiler::compileCommand(const std::vector<Token>& ltoken) {
    const Token& tokenCommand = ltoken[0];
    int tokCommand            = tokenCommand.tok;

    atokenCommand = ltoken;
    if ((tokCommand & Token::expressionCommand) != 0 && !compileExpression()) {
      return false;
    }

    return true;
  }